

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bss_section.cpp
# Opt level: O0

parser<pstore::exchange::import_ns::callbacks> * __thiscall
(anonymous_namespace)::
parse<(pstore::repo::section_kind)2,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>
          (parser<pstore::exchange::import_ns::callbacks> *__return_storage_ptr__,
          _anonymous_namespace_ *this,string *src,database *db,string_mapping *names,
          back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
          *inserter,not_null<pstore::repo::section_content_*> content)

{
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  parser<pstore::exchange::import_ns::callbacks> *this_01;
  undefined1 local_e0 [8];
  parser<pstore::exchange::import_ns::callbacks> parser;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  *inserter_local;
  string_mapping *names_local;
  database *db_local;
  string *src_local;
  not_null<pstore::repo::section_content_*> content_local;
  
  this_01 = __return_storage_ptr__;
  parser.coordinate_ = (coord)names;
  make_json_object_parser<pstore::exchange::import_ns::bss_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping_const*,pstore::gsl::not_null<pstore::repo::section_content*>,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
            ((parser<pstore::exchange::import_ns::callbacks> *)local_e0,(_anonymous_namespace_ *)src
             ,(database *)0x2,(section_kind)db,(string_mapping *)inserter,
             (not_null<pstore::repo::section_content_*>)names,
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              *)__return_storage_ptr__);
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      ((parser<pstore::exchange::import_ns::callbacks> *)local_e0,(string *)this);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
            (this_01,(parser<pstore::exchange::import_ns::callbacks> *)local_e0);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

decltype (auto) parse (std::string const & src, pstore::database * const db,
                           pstore::exchange::import_ns::string_mapping const & names,
                           OutputIterator * const inserter,                        // out
                           not_null<pstore::repo::section_content *> const content // out
    ) {

        // The type used to store the properties of a section of section-kind Kind.
        using section_type = typename pstore::repo::enum_to_section_t<Kind>;
        // Find the rule that is used to import sections represented by an instance of
        // section_type.
        using section_importer =
            pstore::exchange::import_ns::section_to_importer_t<section_type, OutputIterator>;
        // Create a JSON parser which understands this section object.
        auto parser =
            make_json_object_parser<section_importer> (db, Kind, &names, content, inserter);
        // Parse the string.
        parser.input (src).eof ();
        return parser;
    }